

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool coda_XML_ParserReset(XML_Parser parser,XML_Char *encodingName)

{
  tag *ptVar1;
  binding *pbVar2;
  open_internal_entity *poVar3;
  block *pbVar4;
  DTD *pDVar5;
  NAMED *pNVar6;
  TAG *pTVar7;
  OPEN_INTERNAL_ENTITY *pOVar8;
  BINDING *pBVar9;
  TAG *tag;
  OPEN_INTERNAL_ENTITY *pOVar10;
  BINDING *pBVar11;
  BLOCK *pBVar12;
  OPEN_INTERNAL_ENTITY *openEntity;
  BLOCK *pBVar13;
  TAG *pTVar14;
  NAMED **ppNVar15;
  NAMED **ppNVar16;
  ulong uVar17;
  
  if (parser == (XML_Parser)0x0) {
    return '\0';
  }
  if (parser->m_parentParser != (XML_Parser)0x0) {
    return '\0';
  }
  if (parser->m_tagStack != (TAG *)0x0) {
    ptVar1 = parser->m_tagStack;
    pTVar14 = parser->m_freeTagList;
    do {
      pTVar7 = ptVar1;
      ptVar1 = pTVar7->parent;
      pTVar7->parent = pTVar14;
      if (pTVar7->bindings != (BINDING *)0x0) {
        pbVar2 = pTVar7->bindings;
        pBVar11 = parser->m_freeBindingList;
        do {
          pBVar9 = pbVar2;
          pbVar2 = pBVar9->nextTagBinding;
          pBVar9->nextTagBinding = pBVar11;
          pBVar11 = pBVar9;
        } while (pbVar2 != (binding *)0x0);
        parser->m_freeBindingList = pBVar9;
      }
      pTVar7->bindings = (BINDING *)0x0;
      pTVar14 = pTVar7;
    } while (ptVar1 != (tag *)0x0);
    parser->m_freeTagList = pTVar7;
  }
  if (parser->m_openInternalEntities != (OPEN_INTERNAL_ENTITY *)0x0) {
    poVar3 = parser->m_openInternalEntities;
    pOVar10 = parser->m_freeInternalEntities;
    do {
      pOVar8 = poVar3;
      poVar3 = pOVar8->next;
      pOVar8->next = pOVar10;
      pOVar10 = pOVar8;
    } while (poVar3 != (open_internal_entity *)0x0);
    parser->m_freeInternalEntities = pOVar8;
  }
  if (parser->m_inheritedBindings != (BINDING *)0x0) {
    pbVar2 = parser->m_inheritedBindings;
    pBVar11 = parser->m_freeBindingList;
    do {
      pBVar9 = pbVar2;
      pbVar2 = pBVar9->nextTagBinding;
      pBVar9->nextTagBinding = pBVar11;
      pBVar11 = pBVar9;
    } while (pbVar2 != (binding *)0x0);
    parser->m_freeBindingList = pBVar9;
  }
  (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
    (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
  }
  pBVar13 = (parser->m_tempPool).blocks;
  pBVar12 = (parser->m_tempPool).freeBlocks;
  if (pBVar12 == (BLOCK *)0x0) {
LAB_001694cd:
    (parser->m_tempPool).freeBlocks = pBVar13;
  }
  else {
    pbVar4 = pBVar13;
    if (pBVar13 != (BLOCK *)0x0) {
      do {
        pBVar13 = pbVar4;
        pbVar4 = pBVar13->next;
        pBVar13->next = pBVar12;
        pBVar12 = pBVar13;
      } while (pbVar4 != (block *)0x0);
      goto LAB_001694cd;
    }
  }
  (parser->m_tempPool).blocks = (BLOCK *)0x0;
  (parser->m_tempPool).end = (XML_Char *)0x0;
  (parser->m_tempPool).ptr = (XML_Char *)0x0;
  (parser->m_tempPool).start = (XML_Char *)0x0;
  pBVar13 = (parser->m_temp2Pool).blocks;
  pBVar12 = (parser->m_temp2Pool).freeBlocks;
  if (pBVar12 == (BLOCK *)0x0) {
LAB_0016951c:
    (parser->m_temp2Pool).freeBlocks = pBVar13;
  }
  else {
    pbVar4 = pBVar13;
    if (pBVar13 != (BLOCK *)0x0) {
      do {
        pBVar13 = pbVar4;
        pbVar4 = pBVar13->next;
        pBVar13->next = pBVar12;
        pBVar12 = pBVar13;
      } while (pbVar4 != (block *)0x0);
      goto LAB_0016951c;
    }
  }
  ppNVar16 = (NAMED **)0x0;
  (parser->m_temp2Pool).blocks = (BLOCK *)0x0;
  (parser->m_temp2Pool).end = (XML_Char *)0x0;
  (parser->m_temp2Pool).ptr = (XML_Char *)0x0;
  (parser->m_temp2Pool).start = (XML_Char *)0x0;
  (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = (XML_Char *)0x0;
  parserInit(parser,encodingName);
  pDVar5 = parser->m_dtd;
  ppNVar15 = (pDVar5->elementTypes).v;
  if (ppNVar15 != (NAMED **)0x0) {
    ppNVar16 = ppNVar15 + (pDVar5->elementTypes).size;
  }
  while (ppNVar15 != ppNVar16) {
    pNVar6 = *ppNVar15;
    ppNVar15 = ppNVar15 + 1;
    if ((pNVar6 != (NAMED *)0x0) && (*(int *)((long)&pNVar6[3].name + 4) != 0)) {
      (*(parser->m_mem).free_fcn)(pNVar6[4].name);
    }
  }
  if ((pDVar5->generalEntities).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar5->generalEntities).mem)->free_fcn)((pDVar5->generalEntities).v[uVar17]);
      (pDVar5->generalEntities).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar5->generalEntities).size);
  }
  (pDVar5->generalEntities).used = 0;
  pDVar5->paramEntityRead = '\0';
  if ((pDVar5->paramEntities).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar5->paramEntities).mem)->free_fcn)((pDVar5->paramEntities).v[uVar17]);
      (pDVar5->paramEntities).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar5->paramEntities).size);
  }
  (pDVar5->paramEntities).used = 0;
  if ((pDVar5->elementTypes).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar5->elementTypes).mem)->free_fcn)((pDVar5->elementTypes).v[uVar17]);
      (pDVar5->elementTypes).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar5->elementTypes).size);
  }
  (pDVar5->elementTypes).used = 0;
  if ((pDVar5->attributeIds).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar5->attributeIds).mem)->free_fcn)((pDVar5->attributeIds).v[uVar17]);
      (pDVar5->attributeIds).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar5->attributeIds).size);
  }
  (pDVar5->attributeIds).used = 0;
  if ((pDVar5->prefixes).size != 0) {
    uVar17 = 0;
    do {
      (*((pDVar5->prefixes).mem)->free_fcn)((pDVar5->prefixes).v[uVar17]);
      (pDVar5->prefixes).v[uVar17] = (NAMED *)0x0;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (pDVar5->prefixes).size);
  }
  (pDVar5->prefixes).used = 0;
  pBVar13 = (pDVar5->pool).blocks;
  pBVar12 = (pDVar5->pool).freeBlocks;
  if (pBVar12 == (BLOCK *)0x0) {
LAB_001696f3:
    (pDVar5->pool).freeBlocks = pBVar13;
  }
  else {
    pbVar4 = pBVar13;
    if (pBVar13 != (BLOCK *)0x0) {
      do {
        pBVar13 = pbVar4;
        pbVar4 = pBVar13->next;
        pBVar13->next = pBVar12;
        pBVar12 = pBVar13;
      } while (pbVar4 != (block *)0x0);
      goto LAB_001696f3;
    }
  }
  (pDVar5->pool).blocks = (BLOCK *)0x0;
  (pDVar5->pool).end = (XML_Char *)0x0;
  (pDVar5->pool).ptr = (XML_Char *)0x0;
  (pDVar5->pool).start = (XML_Char *)0x0;
  pBVar13 = (pDVar5->entityValuePool).blocks;
  pBVar12 = (pDVar5->entityValuePool).freeBlocks;
  if (pBVar12 != (BLOCK *)0x0) {
    pbVar4 = pBVar13;
    if (pBVar13 == (BLOCK *)0x0) goto LAB_0016974a;
    do {
      pBVar13 = pbVar4;
      pbVar4 = pBVar13->next;
      pBVar13->next = pBVar12;
      pBVar12 = pBVar13;
    } while (pbVar4 != (block *)0x0);
  }
  (pDVar5->entityValuePool).freeBlocks = pBVar13;
LAB_0016974a:
  (pDVar5->entityValuePool).blocks = (BLOCK *)0x0;
  (pDVar5->entityValuePool).end = (XML_Char *)0x0;
  (pDVar5->entityValuePool).ptr = (XML_Char *)0x0;
  (pDVar5->entityValuePool).start = (XML_Char *)0x0;
  (pDVar5->defaultPrefix).name = (XML_Char *)0x0;
  (pDVar5->defaultPrefix).binding = (BINDING *)0x0;
  pDVar5->in_eldecl = '\0';
  (*(parser->m_mem).free_fcn)(pDVar5->scaffIndex);
  pDVar5->scaffIndex = (int *)0x0;
  (*(parser->m_mem).free_fcn)(pDVar5->scaffold);
  pDVar5->scaffCount = 0;
  pDVar5->scaffLevel = 0;
  pDVar5->scaffold = (CONTENT_SCAFFOLD *)0x0;
  pDVar5->contentStringLen = 0;
  pDVar5->scaffSize = 0;
  pDVar5->keepProcessing = '\x01';
  pDVar5->hasParamEntityRefs = '\0';
  pDVar5->standalone = '\0';
  return '\x01';
}

Assistant:

XML_Bool XMLCALL
XML_ParserReset(XML_Parser parser, const XML_Char *encodingName) {
  TAG *tStk;
  OPEN_INTERNAL_ENTITY *openEntityList;

  if (parser == NULL)
    return XML_FALSE;

  if (parser->m_parentParser)
    return XML_FALSE;
  /* move m_tagStack to m_freeTagList */
  tStk = parser->m_tagStack;
  while (tStk) {
    TAG *tag = tStk;
    tStk = tStk->parent;
    tag->parent = parser->m_freeTagList;
    moveToFreeBindingList(parser, tag->bindings);
    tag->bindings = NULL;
    parser->m_freeTagList = tag;
  }
  /* move m_openInternalEntities to m_freeInternalEntities */
  openEntityList = parser->m_openInternalEntities;
  while (openEntityList) {
    OPEN_INTERNAL_ENTITY *openEntity = openEntityList;
    openEntityList = openEntity->next;
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }
  moveToFreeBindingList(parser, parser->m_inheritedBindings);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  poolClear(&parser->m_tempPool);
  poolClear(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = NULL;
  parserInit(parser, encodingName);
  dtdReset(parser->m_dtd, &parser->m_mem);
  return XML_TRUE;
}